

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_reflection_class.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::ReflectionClassGenerator::WriteDescriptor
          (ReflectionClassGenerator *this,Printer *printer)

{
  pointer *ppbVar1;
  FileDescriptor *pFVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  FileDescriptor *descriptor;
  EnumDescriptor *extraout_RDX;
  EnumDescriptor *extraout_RDX_00;
  EnumDescriptor *extraout_RDX_01;
  EnumDescriptor *descriptor_00;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *descriptor_01;
  char *text;
  ulong uVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 local_88 [8];
  string base64;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensions;
  
  io::Printer::Print<char[10],std::__cxx11::string,char[22],std::__cxx11::string>
            (printer,
             "#region Descriptor\n/// <summary>File descriptor for $file_name$</summary>\npublic static pbr::FileDescriptor Descriptor {\n  get { return descriptor; }\n}\nprivate static pbr::FileDescriptor descriptor;\n\nstatic $reflection_class_name$() {\n"
             ,(char (*) [10])"file_name",
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this->file_,
             (char (*) [22])0x2a5e86,&this->reflectionClassname_);
  google::protobuf::io::Printer::Indent();
  io::Printer::Print<>(printer,"byte[] descriptorData = global::System.Convert.FromBase64String(\n")
  ;
  google::protobuf::io::Printer::Indent();
  google::protobuf::io::Printer::Indent();
  io::Printer::Print<>(printer,"string.Concat(\n");
  google::protobuf::io::Printer::Indent();
  FileDescriptorToBase64_abi_cxx11_((string *)local_88,(csharp *)this->file_,descriptor);
  if ((pointer)0x3c < base64._M_dataplus._M_p) {
    ppbVar1 = &extensions.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      std::__cxx11::string::substr((ulong)ppbVar1,(ulong)local_88);
      io::Printer::Print<char[7],std::__cxx11::string>
                (printer,"\"$base64$\",\n",(char (*) [7])"base64",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ppbVar1);
      if (extensions.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&stack0xffffffffffffffc0) {
        operator_delete(extensions.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      std::__cxx11::string::substr((ulong)ppbVar1,(ulong)local_88);
      std::__cxx11::string::operator=((string *)local_88,(string *)ppbVar1);
      if (extensions.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&stack0xffffffffffffffc0) {
        operator_delete(extensions.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    } while ((pointer)0x3c < base64._M_dataplus._M_p);
  }
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88;
  io::Printer::Print<char[7],std::__cxx11::string>
            (printer,"\"$base64$\"));\n",(char (*) [7])"base64",args_1);
  google::protobuf::io::Printer::Outdent();
  google::protobuf::io::Printer::Outdent();
  google::protobuf::io::Printer::Outdent();
  io::Printer::Print<>
            (printer,"descriptor = pbr::FileDescriptor.FromGeneratedCode(descriptorData,\n");
  io::Printer::Print<>(printer,"    new pbr::FileDescriptor[] { ");
  pFVar2 = this->file_;
  if (0 < *(int *)(pFVar2 + 0x20)) {
    iVar6 = 0;
    ppbVar1 = &extensions.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      auVar8 = google::protobuf::FileDescriptor::dependency((int)pFVar2);
      GetReflectionClassName_abi_cxx11_((string *)ppbVar1,auVar8._0_8_,auVar8._8_8_);
      args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ppbVar1;
      io::Printer::Print<char[27],std::__cxx11::string>
                (printer,"$full_reflection_class_name$.Descriptor, ",
                 (char (*) [27])"full_reflection_class_name",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ppbVar1);
      if (extensions.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&stack0xffffffffffffffc0) {
        operator_delete(extensions.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      iVar6 = iVar6 + 1;
      pFVar2 = this->file_;
    } while (iVar6 < *(int *)(pFVar2 + 0x20));
  }
  io::Printer::Print<>(printer,"},\n    new pbr::GeneratedClrTypeInfo(");
  if (*(int *)(this->file_ + 0x30) < 1) {
    text = "null, ";
  }
  else {
    io::Printer::Print<>(printer,"new[] {");
    pFVar2 = this->file_;
    text = "}, ";
    if (0 < *(int *)(pFVar2 + 0x30)) {
      lVar5 = 0;
      ppbVar1 = &extensions.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      lVar7 = 0;
      descriptor_00 = extraout_RDX;
      do {
        GetClassName_abi_cxx11_
                  ((string *)ppbVar1,(csharp *)(*(long *)(pFVar2 + 0x70) + lVar5),descriptor_00);
        io::Printer::Print<char[10],std::__cxx11::string>
                  (printer,"typeof($type_name$), ",(char (*) [10])0x2a27d4,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ppbVar1);
        descriptor_00 = extraout_RDX_00;
        if (extensions.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&stack0xffffffffffffffc0)
        {
          operator_delete(extensions.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
          descriptor_00 = extraout_RDX_01;
        }
        lVar7 = lVar7 + 1;
        pFVar2 = this->file_;
        args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (long)*(int *)(pFVar2 + 0x30);
        lVar5 = lVar5 + 0x50;
      } while (lVar7 < (long)args_1);
      text = "}, ";
    }
  }
  io::Printer::Print<>(printer,text);
  if (*(int *)(this->file_ + 0x38) < 1) {
    io::Printer::Print<>(printer,"null, ");
  }
  else {
    base64.field_2._8_8_ = 0;
    extensions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    extensions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pFVar2 = this->file_;
    if (0 < *(int *)(pFVar2 + 0x38)) {
      lVar7 = 0;
      ppbVar1 = &extensions.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      lVar5 = 0;
      descriptor_01 = extraout_RDX_02;
      do {
        GetFullExtensionName_abi_cxx11_
                  ((string *)ppbVar1,(csharp *)(*(long *)(pFVar2 + 0x80) + lVar7),descriptor_01);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   (base64.field_2._M_local_buf + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ppbVar1);
        descriptor_01 = extraout_RDX_03;
        if (extensions.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&stack0xffffffffffffffc0)
        {
          operator_delete(extensions.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
          descriptor_01 = extraout_RDX_04;
        }
        lVar5 = lVar5 + 1;
        pFVar2 = this->file_;
        args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (long)*(int *)(pFVar2 + 0x38);
        lVar7 = lVar7 + 0x98;
      } while (lVar5 < (long)args_1);
    }
    Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)
               &extensions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (protobuf *)(base64.field_2._M_local_buf + 8),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x2b4e6a,(char *)args_1);
    io::Printer::Print<char[11],std::__cxx11::string>
              (printer,"new pb::Extension[] { $extensions$ }, ",(char (*) [11])0x2cab90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &extensions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (extensions.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)&stack0xffffffffffffffc0) {
      operator_delete(extensions.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&base64.field_2 + 8));
  }
  if (*(int *)(this->file_ + 0x2c) < 1) {
    io::Printer::Print<>(printer,"null));\n");
  }
  else {
    io::Printer::Print<>(printer,"new pbr::GeneratedClrTypeInfo[] {\n");
    google::protobuf::io::Printer::Indent();
    google::protobuf::io::Printer::Indent();
    google::protobuf::io::Printer::Indent();
    pFVar2 = this->file_;
    uVar3 = (ulong)*(uint *)(pFVar2 + 0x2c);
    if (0 < (int)*(uint *)(pFVar2 + 0x2c)) {
      lVar5 = 0;
      uVar4 = 0;
      do {
        WriteGeneratedCodeInfo
                  (this,(Descriptor *)(*(long *)(pFVar2 + 0x68) + lVar5),printer,
                   uVar4 == (int)uVar3 - 1);
        uVar4 = uVar4 + 1;
        pFVar2 = this->file_;
        uVar3 = (ulong)*(int *)(pFVar2 + 0x2c);
        lVar5 = lVar5 + 0x90;
      } while ((long)uVar4 < (long)uVar3);
    }
    google::protobuf::io::Printer::Outdent();
    io::Printer::Print<>(printer,"\n}));\n");
    google::protobuf::io::Printer::Outdent();
    google::protobuf::io::Printer::Outdent();
  }
  google::protobuf::io::Printer::Outdent();
  io::Printer::Print<>(printer,"}\n");
  io::Printer::Print<>(printer,"#endregion\n\n");
  if (local_88 != (undefined1  [8])&base64._M_string_length) {
    operator_delete((void *)local_88);
  }
  return;
}

Assistant:

void ReflectionClassGenerator::WriteDescriptor(io::Printer* printer) {
  printer->Print(
    "#region Descriptor\n"
    "/// <summary>File descriptor for $file_name$</summary>\n"
    "public static pbr::FileDescriptor Descriptor {\n"
    "  get { return descriptor; }\n"
    "}\n"
    "private static pbr::FileDescriptor descriptor;\n"
    "\n"
    "static $reflection_class_name$() {\n",
    "file_name", file_->name(),
    "reflection_class_name", reflectionClassname_);
  printer->Indent();
  printer->Print(
    "byte[] descriptorData = global::System.Convert.FromBase64String(\n");
  printer->Indent();
  printer->Indent();
  printer->Print("string.Concat(\n");
  printer->Indent();

  // TODO(jonskeet): Consider a C#-escaping format here instead of just Base64.
  std::string base64 = FileDescriptorToBase64(file_);
  while (base64.size() > 60) {
    printer->Print("\"$base64$\",\n", "base64", base64.substr(0, 60));
    base64 = base64.substr(60);
  }
  printer->Print("\"$base64$\"));\n", "base64", base64);
  printer->Outdent();
  printer->Outdent();
  printer->Outdent();

  // -----------------------------------------------------------------
  // Invoke InternalBuildGeneratedFileFrom() to build the file.
  printer->Print(
      "descriptor = pbr::FileDescriptor.FromGeneratedCode(descriptorData,\n");
  printer->Print("    new pbr::FileDescriptor[] { ");
  for (int i = 0; i < file_->dependency_count(); i++) {
      printer->Print(
      "$full_reflection_class_name$.Descriptor, ",
      "full_reflection_class_name",
      GetReflectionClassName(file_->dependency(i)));
  }
  printer->Print("},\n"
      "    new pbr::GeneratedClrTypeInfo(");
  // Specify all the generated code information, recursively.
  if (file_->enum_type_count() > 0) {
      printer->Print("new[] {");
      for (int i = 0; i < file_->enum_type_count(); i++) {
          printer->Print("typeof($type_name$), ", "type_name", GetClassName(file_->enum_type(i)));
      }
      printer->Print("}, ");
  }
  else {
      printer->Print("null, ");
  }  
  if (file_->extension_count() > 0) {
    std::vector<std::string> extensions;
    for (int i = 0; i < file_->extension_count(); i++) {
      extensions.push_back(GetFullExtensionName(file_->extension(i)));
    }
    printer->Print("new pb::Extension[] { $extensions$ }, ", "extensions", Join(extensions, ", "));
  }
  else {
    printer->Print("null, ");
  }
  if (file_->message_type_count() > 0) {
      printer->Print("new pbr::GeneratedClrTypeInfo[] {\n");
      printer->Indent();
      printer->Indent();
      printer->Indent();
      for (int i = 0; i < file_->message_type_count(); i++) {
          WriteGeneratedCodeInfo(file_->message_type(i), printer, i == file_->message_type_count() - 1);
      }
      printer->Outdent();
      printer->Print("\n}));\n");
      printer->Outdent();
      printer->Outdent();
  }
  else {
      printer->Print("null));\n");
  }

  printer->Outdent();
  printer->Print("}\n");
  printer->Print("#endregion\n\n");
}